

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

State * __thiscall re2::DFA::WorkqToCachedState(DFA *this,Workq *q,Workq *mq,uint32_t flag)

{
  int iVar1;
  MatchKind MVar2;
  Prog *pPVar3;
  Inst *pIVar4;
  byte bVar5;
  int *inst;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uint ninst;
  long lVar10;
  int *piVar11;
  long lVar12;
  uint uVar13;
  int *piVar14;
  int *piVar15;
  State *pSVar16;
  bool bVar17;
  uint local_54;
  
  lVar9 = (long)q->maxmark_ + (long)q->n_;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (int)lVar9) {
    uVar6 = lVar9 * 4;
  }
  inst = (int *)operator_new__(uVar6);
  if ((q->super_SparseSet).size_ == 0) {
    local_54 = 0;
    bVar17 = true;
    ninst = 0;
  }
  else {
    piVar11 = ((_Head_base<0UL,_int_*,_false> *)
              ((long)&(q->super_SparseSet).dense_.ptr_._M_t.
                      super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                      super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->_M_head_impl
    ;
    ninst = 0;
    local_54 = 0;
    bVar17 = false;
    bVar5 = 0;
    piVar15 = piVar11;
    do {
      iVar1 = *piVar15;
      if ((!bVar17) || ((uVar13 = 2, this->kind_ != kFirstMatch && (iVar1 < q->n_)))) {
        if (iVar1 < q->n_) {
          pPVar3 = this->prog_;
          pIVar4 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                   ((long)&(pPVar3->inst_).ptr_._M_t.
                           super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                   + 8))->_M_head_impl;
          if (((pIVar4[iVar1].out_opcode_ & 7) == 1) && (MVar2 = this->kind_, MVar2 != kManyMatch))
          {
            if (MVar2 == kLongestMatch) {
              if (!(bool)((flag >> 8 & 1) == 0 | bVar5)) {
LAB_001befd2:
                operator_delete__(inst);
                uVar13 = 1;
                goto LAB_001beff0;
              }
            }
            else if (MVar2 == kFirstMatch) {
              if (piVar15 == piVar11) {
                uVar13 = pIVar4[pIVar4[iVar1].out_opcode_ >> 4].out_opcode_ & 7;
                if ((uVar13 == 2) ||
                   ((uVar13 == 6 &&
                    ((pIVar4[pIVar4[pIVar4[iVar1].out_opcode_ >> 4].out_opcode_ >> 4].out_opcode_ &
                     7) == 2)))) goto LAB_001befca;
              }
            }
            else {
LAB_001befca:
              if ((flag >> 8 & 1) != 0) goto LAB_001befd2;
            }
          }
          if ((pIVar4[(long)iVar1 + -1].out_opcode_ & 8) != 0) {
            lVar9 = (long)(int)ninst;
            ninst = ninst + 1;
            inst[lVar9] = iVar1;
          }
          uVar8 = pIVar4[iVar1].out_opcode_ & 7;
          if (uVar8 == 4) {
            local_54 = local_54 | pIVar4[iVar1].field_1.out1_;
          }
          uVar13 = 0;
          if ((uVar8 == 5) && (pPVar3->anchor_end_ == false)) {
            bVar17 = true;
          }
        }
        else {
          uVar13 = 4;
          if ((0 < (int)ninst) && (inst[(ulong)ninst - 1] != -1)) {
            inst[ninst] = -1;
            bVar5 = 1;
            ninst = ninst + 1;
          }
        }
      }
LAB_001beff0:
      if ((uVar13 & 3) != 0) goto LAB_001bf013;
      piVar15 = piVar15 + 1;
      piVar11 = ((_Head_base<0UL,_int_*,_false> *)
                ((long)&(q->super_SparseSet).dense_.ptr_._M_t.
                        super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->
                _M_head_impl;
    } while (piVar15 != piVar11 + (q->super_SparseSet).size_);
    uVar13 = 2;
LAB_001bf013:
    bVar17 = uVar13 == 2;
  }
  pSVar16 = (State *)0x2;
  if (bVar17) {
    if (0 < (int)ninst) {
      ninst = ninst - (inst[(ulong)ninst - 1] == -1);
    }
    uVar13 = flag & 0x100;
    if (local_54 != 0) {
      uVar13 = flag;
    }
    if (ninst == 0 && uVar13 == 0) {
      pSVar16 = (State *)0x1;
    }
    else {
      uVar6 = (ulong)(int)ninst;
      if ((this->kind_ == kLongestMatch) && (0 < (int)ninst)) {
        piVar11 = inst + uVar6;
        piVar15 = inst;
        do {
          piVar14 = piVar15;
          if (*piVar15 == -1) {
            lVar9 = 4;
          }
          else {
            do {
              piVar14 = piVar14 + 1;
              if (piVar11 <= piVar14) {
                lVar9 = 0;
                goto LAB_001bf0cf;
              }
            } while (*piVar14 != -1);
            lVar9 = (ulong)(piVar14 < piVar11) << 2;
          }
LAB_001bf0cf:
          if (piVar15 != piVar14) {
            uVar7 = (long)piVar14 - (long)piVar15 >> 2;
            lVar10 = 0x3f;
            if (uVar7 != 0) {
              for (; uVar7 >> lVar10 == 0; lVar10 = lVar10 + -1) {
              }
            }
            std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (piVar15,piVar14,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
            std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(piVar15);
          }
          piVar15 = (int *)((long)piVar14 + lVar9);
        } while (piVar15 < piVar11);
      }
      if ((ninst != 0) && (this->kind_ == kManyMatch)) {
        lVar9 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (inst,inst + uVar6,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(inst);
      }
      if (mq != (Workq *)0x0) {
        ninst = ninst + 1;
        inst[uVar6] = -2;
        lVar9 = (long)(mq->super_SparseSet).size_;
        if (lVar9 != 0) {
          piVar11 = ((_Head_base<0UL,_int_*,_false> *)
                    ((long)&(mq->super_SparseSet).dense_.ptr_._M_t.
                            super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                            super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->
                    _M_head_impl;
          pIVar4 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                   ((long)&(this->prog_->inst_).ptr_._M_t.
                           super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                   + 8))->_M_head_impl;
          lVar10 = 0;
          do {
            iVar1 = *(int *)((long)piVar11 + lVar10);
            if ((pIVar4[iVar1].out_opcode_ & 7) == 5) {
              lVar12 = (long)(int)ninst;
              ninst = ninst + 1;
              *(anon_union_4_5_a3ff96c3_for_Inst_2 *)(inst + lVar12) = pIVar4[iVar1].field_1;
            }
            lVar10 = lVar10 + 4;
          } while (lVar9 * 4 != lVar10);
        }
      }
      pSVar16 = CachedState(this,inst,ninst,uVar13 | local_54 << 0x10);
    }
    operator_delete__(inst);
  }
  return pSVar16;
}

Assistant:

DFA::State* DFA::WorkqToCachedState(Workq* q, Workq* mq, uint32_t flag) {
  //mutex_.AssertHeld();

  // Construct array of instruction ids for the new state.
  // Only ByteRange, EmptyWidth, and Match instructions are useful to keep:
  // those are the only operators with any effect in
  // RunWorkqOnEmptyString or RunWorkqOnByte.
  int* inst = new int[q->size()];
  int n = 0;
  uint32_t needflags = 0;  // flags needed by kInstEmptyWidth instructions
  bool sawmatch = false;   // whether queue contains guaranteed kInstMatch
  bool sawmark = false;    // whether queue contains a Mark
  if (ExtraDebug)
    fprintf(stderr, "WorkqToCachedState %s [%#x]", DumpWorkq(q).c_str(), flag);
  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    int id = *it;
    if (sawmatch && (kind_ == Prog::kFirstMatch || q->is_mark(id)))
      break;
    if (q->is_mark(id)) {
      if (n > 0 && inst[n-1] != Mark) {
        sawmark = true;
        inst[n++] = Mark;
      }
      continue;
    }
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      case kInstAltMatch:
        // This state will continue to a match no matter what
        // the rest of the input is.  If it is the highest priority match
        // being considered, return the special FullMatchState
        // to indicate that it's all matches from here out.
        if (kind_ != Prog::kManyMatch &&
            (kind_ != Prog::kFirstMatch ||
             (it == q->begin() && ip->greedy(prog_))) &&
            (kind_ != Prog::kLongestMatch || !sawmark) &&
            (flag & kFlagMatch)) {
          delete[] inst;
          if (ExtraDebug)
            fprintf(stderr, " -> FullMatchState\n");
          return FullMatchState;
        }
        FALLTHROUGH_INTENDED;
      default:
        // Record iff id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        if (prog_->inst(id-1)->last())
          inst[n++] = *it;
        if (ip->opcode() == kInstEmptyWidth)
          needflags |= ip->empty();
        if (ip->opcode() == kInstMatch && !prog_->anchor_end())
          sawmatch = true;
        break;
    }
  }
  DCHECK_LE(n, q->size());
  if (n > 0 && inst[n-1] == Mark)
    n--;

  // If there are no empty-width instructions waiting to execute,
  // then the extra flag bits will not be used, so there is no
  // point in saving them.  (Discarding them reduces the number
  // of distinct states.)
  if (needflags == 0)
    flag &= kFlagMatch;

  // NOTE(rsc): The code above cannot do flag &= needflags,
  // because if the right flags were present to pass the current
  // kInstEmptyWidth instructions, new kInstEmptyWidth instructions
  // might be reached that in turn need different flags.
  // The only sure thing is that if there are no kInstEmptyWidth
  // instructions at all, no flags will be needed.
  // We could do the extra work to figure out the full set of
  // possibly needed flags by exploring past the kInstEmptyWidth
  // instructions, but the check above -- are any flags needed
  // at all? -- handles the most common case.  More fine-grained
  // analysis can only be justified by measurements showing that
  // too many redundant states are being allocated.

  // If there are no Insts in the list, it's a dead state,
  // which is useful to signal with a special pointer so that
  // the execution loop can stop early.  This is only okay
  // if the state is *not* a matching state.
  if (n == 0 && flag == 0) {
    delete[] inst;
    if (ExtraDebug)
      fprintf(stderr, " -> DeadState\n");
    return DeadState;
  }

  // If we're in longest match mode, the state is a sequence of
  // unordered state sets separated by Marks.  Sort each set
  // to canonicalize, to reduce the number of distinct sets stored.
  if (kind_ == Prog::kLongestMatch) {
    int* ip = inst;
    int* ep = ip + n;
    while (ip < ep) {
      int* markp = ip;
      while (markp < ep && *markp != Mark)
        markp++;
      std::sort(ip, markp);
      if (markp < ep)
        markp++;
      ip = markp;
    }
  }

  // If we're in many match mode, canonicalize for similar reasons:
  // we have an unordered set of states (i.e. we don't have Marks)
  // and sorting will reduce the number of distinct sets stored.
  if (kind_ == Prog::kManyMatch) {
    int* ip = inst;
    int* ep = ip + n;
    std::sort(ip, ep);
  }

  // Append MatchSep and the match IDs in mq if necessary.
  if (mq != NULL) {
    inst[n++] = MatchSep;
    for (Workq::iterator i = mq->begin(); i != mq->end(); ++i) {
      int id = *i;
      Prog::Inst* ip = prog_->inst(id);
      if (ip->opcode() == kInstMatch)
        inst[n++] = ip->match_id();
    }
  }

  // Save the needed empty-width flags in the top bits for use later.
  flag |= needflags << kFlagNeedShift;

  State* state = CachedState(inst, n, flag);
  delete[] inst;
  return state;
}